

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmScanDepFormat.cxx
# Opt level: O2

bool cmScanDepFormat_P1689_Parse(string *arg_pp,cmScanDepInfo *info)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  cmScanDepInfo *this_01;
  undefined4 uVar2;
  bool bVar3;
  bool bVar4;
  UInt UVar5;
  ArrayIndex AVar6;
  Value *pVVar7;
  vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> *this_02;
  Value *pVVar8;
  Value *pVVar9;
  bool bVar10;
  Reader *this_03;
  const_iterator cVar11;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __y_01;
  string lookup_method_str;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  work_directory;
  SelfType local_3f0;
  cmScanDepInfo *local_3e0;
  undefined1 local_3d8 [32];
  SelfType local_3b8;
  Reader reader;
  ValueIteratorBase local_280;
  Value ppio;
  SelfType local_248;
  ifstream ppf;
  
  Json::Value::Value(&ppio,nullValue);
  std::ifstream::ifstream(&ppf,(arg_pp->_M_dataplus)._M_p,_S_in|_S_bin);
  Json::Reader::Reader(&reader);
  bVar3 = Json::Reader::parse(&reader,(istream *)&ppf,&ppio,false);
  if (bVar3) {
    local_3e0 = info;
    Json::Reader::~Reader(&reader);
    pVVar7 = Json::Value::operator[](&ppio,"version");
    UVar5 = Json::Value::asUInt(pVVar7);
    if (UVar5 < 2) {
      pVVar7 = Json::Value::operator[](&ppio,"rules");
      bVar3 = Json::Value::isArray(pVVar7);
      bVar10 = true;
      if (!bVar3) goto LAB_00509efb;
      AVar6 = Json::Value::size(pVVar7);
      if (AVar6 == 1) {
        cVar11 = Json::Value::begin(pVVar7);
        local_280.current_ = cVar11.super_ValueIteratorBase.current_._M_node;
        local_280.isNull_ = cVar11.super_ValueIteratorBase.isNull_;
        cVar11 = Json::Value::end(pVVar7);
        local_248.current_ = cVar11.super_ValueIteratorBase.current_._M_node;
        local_248.isNull_ = cVar11.super_ValueIteratorBase.isNull_;
        this = &local_3e0->ExtraOutputs;
        this_00 = &local_3e0->Provides;
        this_02 = &local_3e0->Requires;
        while( true ) {
          bVar3 = Json::ValueIteratorBase::operator!=(&local_280,&local_248);
          if (!bVar3) break;
          pVVar7 = Json::ValueIteratorBase::deref(&local_280);
          work_directory.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged = false;
          pVVar8 = Json::Value::operator[](pVVar7,"work-directory");
          bVar3 = Json::Value::isString(pVVar8);
          if (!bVar3) {
            bVar3 = Json::Value::isNull(pVVar8);
            if (bVar3) goto LAB_0050a094;
            cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[33]>
                      ((string *)&reader,(char (*) [39])"-E cmake_ninja_dyndep failed to parse ",
                       arg_pp,(char (*) [33])": work-directory is not a string");
            cmSystemTools::Error((string *)&reader);
LAB_0050ac3d:
            std::__cxx11::string::~string((string *)&reader);
LAB_0050ab79:
            std::
            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&work_directory);
            goto LAB_00509ef9;
          }
          reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
          super__Deque_impl_data._M_map =
               &reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_start._M_cur;
          reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
          super__Deque_impl_data._M_map_size = 0;
          reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
          super__Deque_impl_data._M_start._M_cur._0_1_ = 0;
          bVar3 = ParseFilename(pVVar8,(string *)&reader);
          if (bVar3) {
            std::optional<std::__cxx11::string>::operator=
                      ((optional<std::__cxx11::string> *)&work_directory,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader)
            ;
          }
          else {
            cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[15]>
                      (&lookup_method_str,(char (*) [39])"-E cmake_ninja_dyndep failed to parse ",
                       arg_pp,(char (*) [15])": invalid blob");
            cmSystemTools::Error(&lookup_method_str);
            std::__cxx11::string::~string((string *)&lookup_method_str);
          }
          std::__cxx11::string::~string((string *)&reader);
          if (!bVar3) goto LAB_0050ab79;
LAB_0050a094:
          bVar3 = Json::Value::isMember(pVVar7,"primary-output");
          if (bVar3) {
            pVVar8 = Json::Value::operator[](pVVar7,"primary-output");
            bVar3 = ParseFilename(pVVar8,&local_3e0->PrimaryOutput);
            if (!bVar3) {
              cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[19]>
                        ((string *)&reader,(char (*) [39])"-E cmake_ninja_dyndep failed to parse ",
                         arg_pp,(char (*) [19])": invalid filename");
              cmSystemTools::Error((string *)&reader);
              goto LAB_0050ac3d;
            }
            if ((work_directory.
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_engaged == true) &&
               (work_directory.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_payload._M_value._M_string_length != 0)) {
              bVar3 = cmsys::SystemTools::FileIsFullPath(&local_3e0->PrimaryOutput);
              this_01 = local_3e0;
              if (!bVar3) {
                lookup_method_str._M_dataplus._M_p._0_1_ = 0x2f;
                cmStrCat<std::__cxx11::string&,char,std::__cxx11::string&>
                          ((string *)&reader,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &work_directory,(char *)&lookup_method_str,&local_3e0->PrimaryOutput);
                std::__cxx11::string::operator=((string *)this_01,(string *)&reader);
                std::__cxx11::string::~string((string *)&reader);
              }
            }
          }
          bVar3 = Json::Value::isMember(pVVar7,"outputs");
          if (bVar3) {
            pVVar8 = Json::Value::operator[](pVVar7,"outputs");
            bVar3 = Json::Value::isArray(pVVar8);
            if (bVar3) {
              cVar11 = Json::Value::begin(pVVar8);
              local_3d8._0_8_ = cVar11.super_ValueIteratorBase.current_._M_node;
              local_3d8[8] = cVar11.super_ValueIteratorBase.isNull_;
              cVar11 = Json::Value::end(pVVar8);
              local_3f0.current_ = cVar11.super_ValueIteratorBase.current_._M_node;
              local_3f0.isNull_ = cVar11.super_ValueIteratorBase.isNull_;
              while( true ) {
                bVar3 = Json::ValueIteratorBase::operator!=
                                  ((ValueIteratorBase *)local_3d8,&local_3f0);
                if (!bVar3) break;
                pVVar8 = Json::ValueIteratorBase::deref((ValueIteratorBase *)local_3d8);
                reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_map =
                     &reader.nodes_.c.
                      super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                      super__Deque_impl_data._M_start._M_cur;
                reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_map_size = 0;
                reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_start._M_cur._0_1_ = 0;
                bVar3 = ParseFilename(pVVar8,(string *)&reader);
                if (bVar3) {
                  if ((work_directory.
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ._M_engaged == true) &&
                     (work_directory.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._M_value._M_string_length != 0)) {
                    bVar4 = cmsys::SystemTools::FileIsFullPath((string *)&reader);
                    if (!bVar4) {
                      local_3b8.current_._M_node._0_1_ = 0x2f;
                      cmStrCat<std::__cxx11::string&,char,std::__cxx11::string&>
                                (&lookup_method_str,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&work_directory,(char *)&local_3b8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&reader);
                      std::__cxx11::string::operator=
                                ((string *)&reader,(string *)&lookup_method_str);
                      std::__cxx11::string::~string((string *)&lookup_method_str);
                    }
                  }
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string&>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&reader);
                }
                else {
                  cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[19]>
                            (&lookup_method_str,
                             (char (*) [39])"-E cmake_ninja_dyndep failed to parse ",arg_pp,
                             (char (*) [19])": invalid filename");
                  cmSystemTools::Error(&lookup_method_str);
                  std::__cxx11::string::~string((string *)&lookup_method_str);
                }
                std::__cxx11::string::~string((string *)&reader);
                if (!bVar3) goto LAB_0050ab79;
                Json::ValueIteratorBase::increment((ValueIteratorBase *)local_3d8);
              }
            }
          }
          bVar3 = Json::Value::isMember(pVVar7,"provides");
          if (bVar3) {
            pVVar8 = Json::Value::operator[](pVVar7,"provides");
            bVar3 = Json::Value::isArray(pVVar8);
            if (!bVar3) {
              cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[27]>
                        ((string *)&reader,(char (*) [39])"-E cmake_ninja_dyndep failed to parse ",
                         arg_pp,(char (*) [27])": provides is not an array");
              cmSystemTools::Error((string *)&reader);
              goto LAB_0050ac3d;
            }
            cVar11 = Json::Value::begin(pVVar8);
            local_3d8._0_8_ = cVar11.super_ValueIteratorBase.current_._M_node;
            local_3d8[8] = cVar11.super_ValueIteratorBase.isNull_;
            cVar11 = Json::Value::end(pVVar8);
            local_3f0.current_ = cVar11.super_ValueIteratorBase.current_._M_node;
            local_3f0.isNull_ = cVar11.super_ValueIteratorBase.isNull_;
            while( true ) {
              bVar3 = Json::ValueIteratorBase::operator!=((ValueIteratorBase *)local_3d8,&local_3f0)
              ;
              if (!bVar3) break;
              pVVar8 = Json::ValueIteratorBase::deref((ValueIteratorBase *)local_3d8);
              reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_map =
                   &reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur;
              reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_map_size = 0;
              reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_start._M_cur._0_1_ = 0;
              reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_start._M_last =
                   (_Elt_pointer)
                   &reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish;
              reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
              reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur._0_1_ = 0;
              reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)&reader.errors_;
              reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
              reader.errors_.
              super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>.
              _M_impl.super__Deque_impl_data._M_map._0_1_ = 0;
              reader.errors_.
              super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>.
              _M_impl.super__Deque_impl_data._M_start._M_cur._0_2_ = 0x100;
              reader.errors_.
              super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>.
              _M_impl.super__Deque_impl_data._M_start._M_cur._4_4_ = 0;
              pVVar9 = Json::Value::operator[](pVVar8,"logical-name");
              bVar3 = ParseFilename(pVVar9,(string *)&reader);
              if (!bVar3) {
                cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[15]>
                          (&lookup_method_str,
                           (char (*) [39])"-E cmake_ninja_dyndep failed to parse ",arg_pp,
                           (char (*) [15])": invalid blob");
                cmSystemTools::Error(&lookup_method_str);
                goto LAB_0050ab64;
              }
              bVar3 = Json::Value::isMember(pVVar8,"compiled-module-path");
              if (bVar3) {
                pVVar9 = Json::Value::operator[](pVVar8,"compiled-module-path");
                bVar3 = ParseFilename(pVVar9,(string *)
                                             ((long)&reader.nodes_.c.
                                                                                                          
                                                  super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>
                                                  ._M_impl.super__Deque_impl_data._M_finish + 0x10))
                ;
                if (!bVar3) {
                  cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[19]>
                            (&lookup_method_str,
                             (char (*) [39])"-E cmake_ninja_dyndep failed to parse ",arg_pp,
                             (char (*) [19])": invalid filename");
                  cmSystemTools::Error(&lookup_method_str);
                  goto LAB_0050ab64;
                }
                if ((work_directory.
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_engaged == true) &&
                   (work_directory.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload._M_value._M_string_length != 0)) {
                  bVar3 = cmsys::SystemTools::FileIsFullPath
                                    ((string *)
                                     ((long)&reader.nodes_.c.
                                             super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>
                                             ._M_impl.super__Deque_impl_data._M_finish + 0x10));
                  if (!bVar3) {
                    local_3b8.current_._M_node._0_1_ = 0x2f;
                    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&reader.nodes_.c.
                                     super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>
                                     ._M_impl.super__Deque_impl_data._M_finish + 0x10);
                    cmStrCat<std::__cxx11::string&,char,std::__cxx11::string&>
                              (&lookup_method_str,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &work_directory,(char *)&local_3b8,pbVar1);
                    std::__cxx11::string::operator=((string *)pbVar1,(string *)&lookup_method_str);
                    std::__cxx11::string::~string((string *)&lookup_method_str);
                  }
                }
              }
              bVar3 = Json::Value::isMember(pVVar8,"unique-on-source-path");
              if (bVar3) {
                pVVar9 = Json::Value::operator[](pVVar8,"unique-on-source-path");
                bVar3 = Json::Value::isBool(pVVar9);
                if (!bVar3) {
                  cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[41]>
                            (&lookup_method_str,
                             (char (*) [39])"-E cmake_ninja_dyndep failed to parse ",arg_pp,
                             (char (*) [41])": unique-on-source-path is not a boolean");
                  cmSystemTools::Error(&lookup_method_str);
                  goto LAB_0050ab64;
                }
                bVar3 = Json::Value::asBool(pVVar9);
              }
              else {
                bVar3 = false;
              }
              reader.errors_.
              super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>.
              _M_impl.super__Deque_impl_data._M_start._M_cur._0_1_ = bVar3;
              bVar3 = Json::Value::isMember(pVVar8,"source-path");
              if (bVar3) {
                pVVar9 = Json::Value::operator[](pVVar8,"source-path");
                bVar3 = ParseFilename(pVVar9,(string *)
                                             ((long)&reader.nodes_.c.
                                                                                                          
                                                  super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>
                                                  ._M_impl.super__Deque_impl_data._M_start + 0x10));
                if (!bVar3) {
                  cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[19]>
                            (&lookup_method_str,
                             (char (*) [39])"-E cmake_ninja_dyndep failed to parse ",arg_pp,
                             (char (*) [19])": invalid filename");
                  cmSystemTools::Error(&lookup_method_str);
                  goto LAB_0050ab64;
                }
                if ((work_directory.
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_engaged == true) &&
                   (work_directory.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload._M_value._M_string_length != 0)) {
                  bVar3 = cmsys::SystemTools::FileIsFullPath
                                    ((string *)
                                     ((long)&reader.nodes_.c.
                                             super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>
                                             ._M_impl.super__Deque_impl_data._M_start + 0x10));
                  if (!bVar3) {
                    local_3b8.current_._M_node._0_1_ = 0x2f;
                    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&reader.nodes_.c.
                                     super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>
                                     ._M_impl.super__Deque_impl_data._M_start + 0x10);
                    cmStrCat<std::__cxx11::string&,char,std::__cxx11::string&>
                              (&lookup_method_str,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &work_directory,(char *)&local_3b8,pbVar1);
                    std::__cxx11::string::operator=((string *)pbVar1,(string *)&lookup_method_str);
                    std::__cxx11::string::~string((string *)&lookup_method_str);
                  }
                }
              }
              else if ((char)reader.errors_.
                             super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur == '\x01') {
                cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[25]>
                          (&lookup_method_str,
                           (char (*) [39])"-E cmake_ninja_dyndep failed to parse ",arg_pp,
                           (char (*) [25])": source-path is missing");
                cmSystemTools::Error(&lookup_method_str);
                goto LAB_0050ab64;
              }
              bVar3 = Json::Value::isMember(pVVar8,"is-interface");
              bVar4 = true;
              if (bVar3) {
                pVVar8 = Json::Value::operator[](pVVar8,"is-interface");
                bVar3 = Json::Value::isBool(pVVar8);
                if (!bVar3) {
                  cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[32]>
                            (&lookup_method_str,
                             (char (*) [39])"-E cmake_ninja_dyndep failed to parse ",arg_pp,
                             (char (*) [32])": is-interface is not a boolean");
                  cmSystemTools::Error(&lookup_method_str);
                  goto LAB_0050ab64;
                }
                bVar4 = Json::Value::asBool(pVVar8);
              }
              reader.errors_.
              super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>.
              _M_impl.super__Deque_impl_data._M_start._M_cur._1_1_ = bVar4;
              std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::push_back
                        (this_00,(value_type *)&reader);
              cmSourceReqInfo::~cmSourceReqInfo((cmSourceReqInfo *)&reader);
              Json::ValueIteratorBase::increment((ValueIteratorBase *)local_3d8);
            }
          }
          bVar3 = Json::Value::isMember(pVVar7,"requires");
          if (bVar3) {
            pVVar7 = Json::Value::operator[](pVVar7,"requires");
            bVar3 = Json::Value::isArray(pVVar7);
            if (!bVar3) {
              cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[27]>
                        ((string *)&reader,(char (*) [39])"-E cmake_ninja_dyndep failed to parse ",
                         arg_pp,(char (*) [27])": requires is not an array");
              cmSystemTools::Error((string *)&reader);
              goto LAB_0050ac3d;
            }
            cVar11 = Json::Value::begin(pVVar7);
            local_3f0.current_ = cVar11.super_ValueIteratorBase.current_._M_node;
            local_3f0.isNull_ = cVar11.super_ValueIteratorBase.isNull_;
            cVar11 = Json::Value::end(pVVar7);
            local_3b8.current_ = cVar11.super_ValueIteratorBase.current_._M_node;
            local_3b8.isNull_ = cVar11.super_ValueIteratorBase.isNull_;
LAB_0050a613:
            bVar3 = Json::ValueIteratorBase::operator!=(&local_3f0,&local_3b8);
            if (!bVar3) goto LAB_0050a953;
            pVVar7 = Json::ValueIteratorBase::deref(&local_3f0);
            reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl
            .super__Deque_impl_data._M_map =
                 &reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur;
            reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl
            .super__Deque_impl_data._M_map_size = 0;
            reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl
            .super__Deque_impl_data._M_start._M_cur._0_1_ = 0;
            reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl
            .super__Deque_impl_data._M_start._M_last =
                 (_Elt_pointer)
                 &reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish;
            reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl
            .super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
            reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl
            .super__Deque_impl_data._M_finish._M_cur._0_1_ = 0;
            reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl
            .super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)&reader.errors_;
            reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl
            .super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
            reader.errors_.
            super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>.
            _M_impl.super__Deque_impl_data._M_map._0_1_ = 0;
            reader.errors_.
            super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur._0_2_ = 0x100;
            reader.errors_.
            super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur._4_4_ = 0;
            pVVar8 = Json::Value::operator[](pVVar7,"logical-name");
            bVar3 = ParseFilename(pVVar8,(string *)&reader);
            if (!bVar3) {
              cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[15]>
                        (&lookup_method_str,(char (*) [39])"-E cmake_ninja_dyndep failed to parse ",
                         arg_pp,(char (*) [15])": invalid blob");
              cmSystemTools::Error(&lookup_method_str);
              goto LAB_0050ab64;
            }
            bVar3 = Json::Value::isMember(pVVar7,"compiled-module-path");
            if (!bVar3) {
LAB_0050a76c:
              bVar3 = Json::Value::isMember(pVVar7,"unique-on-source-path");
              if (bVar3) {
                pVVar8 = Json::Value::operator[](pVVar7,"unique-on-source-path");
                bVar3 = Json::Value::isBool(pVVar8);
                if (!bVar3) {
                  cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[41]>
                            (&lookup_method_str,
                             (char (*) [39])"-E cmake_ninja_dyndep failed to parse ",arg_pp,
                             (char (*) [41])": unique-on-source-path is not a boolean");
                  cmSystemTools::Error(&lookup_method_str);
                  goto LAB_0050ab64;
                }
                bVar3 = Json::Value::asBool(pVVar8);
              }
              else {
                bVar3 = false;
              }
              reader.errors_.
              super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>.
              _M_impl.super__Deque_impl_data._M_start._M_cur._0_1_ = bVar3;
              bVar3 = Json::Value::isMember(pVVar7,"source-path");
              if (bVar3) {
                pVVar8 = Json::Value::operator[](pVVar7,"source-path");
                bVar3 = ParseFilename(pVVar8,(string *)
                                             ((long)&reader.nodes_.c.
                                                                                                          
                                                  super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>
                                                  ._M_impl.super__Deque_impl_data._M_start + 0x10));
                if (!bVar3) {
                  cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[19]>
                            (&lookup_method_str,
                             (char (*) [39])"-E cmake_ninja_dyndep failed to parse ",arg_pp,
                             (char (*) [19])": invalid filename");
                  cmSystemTools::Error(&lookup_method_str);
                  goto LAB_0050ab64;
                }
                if ((work_directory.
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_engaged == true) &&
                   (work_directory.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload._M_value._M_string_length != 0)) {
                  bVar3 = cmsys::SystemTools::FileIsFullPath
                                    ((string *)
                                     ((long)&reader.nodes_.c.
                                             super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>
                                             ._M_impl.super__Deque_impl_data._M_start + 0x10));
                  if (!bVar3) {
                    local_3d8[0] = 0x2f;
                    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&reader.nodes_.c.
                                     super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>
                                     ._M_impl.super__Deque_impl_data._M_start + 0x10);
                    cmStrCat<std::__cxx11::string&,char,std::__cxx11::string&>
                              (&lookup_method_str,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &work_directory,local_3d8,pbVar1);
                    std::__cxx11::string::operator=((string *)pbVar1,(string *)&lookup_method_str);
                    std::__cxx11::string::~string((string *)&lookup_method_str);
                  }
                }
              }
              else if ((char)reader.errors_.
                             super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur == '\x01') {
                cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[25]>
                          (&lookup_method_str,
                           (char (*) [39])"-E cmake_ninja_dyndep failed to parse ",arg_pp,
                           (char (*) [25])": source-path is missing");
                cmSystemTools::Error(&lookup_method_str);
                goto LAB_0050ab64;
              }
              bVar3 = Json::Value::isMember(pVVar7,"lookup-method");
              if (bVar3) {
                pVVar7 = Json::Value::operator[](pVVar7,"lookup-method");
                bVar3 = Json::Value::isString(pVVar7);
                if (!bVar3) {
                  cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[32]>
                            (&lookup_method_str,
                             (char (*) [39])"-E cmake_ninja_dyndep failed to parse ",arg_pp,
                             (char (*) [32])": lookup-method is not a string");
                  cmSystemTools::Error(&lookup_method_str);
                  goto LAB_0050ab64;
                }
                Json::Value::asString_abi_cxx11_(&lookup_method_str,pVVar7);
                __x._M_str._1_7_ = lookup_method_str._M_dataplus._M_p._1_7_;
                __x._M_str._0_1_ = lookup_method_str._M_dataplus._M_p._0_1_;
                __x._M_len = lookup_method_str._M_string_length;
                __y._M_str = "by-name";
                __y._M_len = 7;
                bVar3 = std::operator==(__x,__y);
                uVar2 = 0;
                if (!bVar3) {
                  __x_00._M_str._1_7_ = lookup_method_str._M_dataplus._M_p._1_7_;
                  __x_00._M_str._0_1_ = lookup_method_str._M_dataplus._M_p._0_1_;
                  __x_00._M_len = lookup_method_str._M_string_length;
                  __y_00._M_str = "include-angle";
                  __y_00._M_len = 0xd;
                  bVar3 = std::operator==(__x_00,__y_00);
                  uVar2 = 1;
                  if (!bVar3) {
                    __x_01._M_str._1_7_ = lookup_method_str._M_dataplus._M_p._1_7_;
                    __x_01._M_str._0_1_ = lookup_method_str._M_dataplus._M_p._0_1_;
                    __x_01._M_len = lookup_method_str._M_string_length;
                    __y_01._M_str = "include-quote";
                    __y_01._M_len = 0xd;
                    bVar3 = std::operator==(__x_01,__y_01);
                    uVar2 = 2;
                    if (!bVar3) {
                      cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[33],std::__cxx11::string&>
                                ((string *)local_3d8,
                                 (char (*) [39])"-E cmake_ninja_dyndep failed to parse ",arg_pp,
                                 (char (*) [33])": lookup-method is not a valid: ",
                                 &lookup_method_str);
                      cmSystemTools::Error((string *)local_3d8);
                      std::__cxx11::string::~string((string *)local_3d8);
                      goto LAB_0050ab64;
                    }
                  }
                }
                reader.errors_.
                super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur._4_4_ = uVar2;
                std::__cxx11::string::~string((string *)&lookup_method_str);
              }
              else if ((char)reader.errors_.
                             super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur == '\x01') {
                reader.errors_.
                super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur._4_4_ = 0;
              }
              std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::push_back
                        (this_02,(value_type *)&reader);
              cmSourceReqInfo::~cmSourceReqInfo((cmSourceReqInfo *)&reader);
              Json::ValueIteratorBase::increment(&local_3f0);
              goto LAB_0050a613;
            }
            pVVar8 = Json::Value::operator[](pVVar7,"compiled-module-path");
            bVar3 = ParseFilename(pVVar8,(string *)
                                         ((long)&reader.nodes_.c.
                                                 super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>
                                                 ._M_impl.super__Deque_impl_data._M_finish + 0x10));
            if (bVar3) {
              if ((work_directory.
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_engaged == true) &&
                 (work_directory.
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_payload._M_value._M_string_length != 0)) {
                bVar3 = cmsys::SystemTools::FileIsFullPath
                                  ((string *)
                                   ((long)&reader.nodes_.c.
                                           super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>
                                           ._M_impl.super__Deque_impl_data._M_finish + 0x10));
                if (!bVar3) {
                  local_3d8[0] = 0x2f;
                  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&reader.nodes_.c.
                                   super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                                   _M_impl.super__Deque_impl_data._M_finish + 0x10);
                  cmStrCat<std::__cxx11::string&,char,std::__cxx11::string&>
                            (&lookup_method_str,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &work_directory,local_3d8,pbVar1);
                  std::__cxx11::string::operator=((string *)pbVar1,(string *)&lookup_method_str);
                  std::__cxx11::string::~string((string *)&lookup_method_str);
                }
              }
              goto LAB_0050a76c;
            }
            cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[19]>
                      (&lookup_method_str,(char (*) [39])"-E cmake_ninja_dyndep failed to parse ",
                       arg_pp,(char (*) [19])": invalid filename");
            cmSystemTools::Error(&lookup_method_str);
LAB_0050ab64:
            std::__cxx11::string::~string((string *)&lookup_method_str);
            cmSourceReqInfo::~cmSourceReqInfo((cmSourceReqInfo *)&reader);
            goto LAB_0050ab79;
          }
LAB_0050a953:
          std::
          _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&work_directory);
          Json::ValueIteratorBase::increment(&local_280);
        }
        goto LAB_00509efb;
      }
      cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[26]>
                ((string *)&reader,(char (*) [39])"-E cmake_ninja_dyndep failed to parse ",arg_pp,
                 (char (*) [26])": expected 1 source entry");
      cmSystemTools::Error((string *)&reader);
      this_03 = &reader;
    }
    else {
      Json::Value::asString_abi_cxx11_((String *)&work_directory,pVVar7);
      cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[11],std::__cxx11::string>
                ((string *)&reader,(char (*) [39])"-E cmake_ninja_dyndep failed to parse ",arg_pp,
                 (char (*) [11])": version ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &work_directory);
      cmSystemTools::Error((string *)&reader);
      std::__cxx11::string::~string((string *)&reader);
      this_03 = (Reader *)&work_directory;
    }
    std::__cxx11::string::~string((string *)this_03);
  }
  else {
    Json::Reader::getFormattedErrorMessages_abi_cxx11_(&lookup_method_str,&reader);
    cmStrCat<char_const(&)[39],std::__cxx11::string_const&,std::__cxx11::string>
              ((string *)&work_directory,(char (*) [39])"-E cmake_ninja_dyndep failed to parse ",
               arg_pp,&lookup_method_str);
    cmSystemTools::Error((string *)&work_directory);
    std::__cxx11::string::~string((string *)&work_directory);
    std::__cxx11::string::~string((string *)&lookup_method_str);
    Json::Reader::~Reader(&reader);
  }
LAB_00509ef9:
  bVar10 = false;
LAB_00509efb:
  std::ifstream::~ifstream(&ppf);
  Json::Value::~Value(&ppio);
  return bVar10;
}

Assistant:

bool cmScanDepFormat_P1689_Parse(std::string const& arg_pp,
                                 cmScanDepInfo* info)
{
  Json::Value ppio;
  Json::Value const& ppi = ppio;
  cmsys::ifstream ppf(arg_pp.c_str(), std::ios::in | std::ios::binary);
  {
    Json::Reader reader;
    if (!reader.parse(ppf, ppio, false)) {
      cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to parse ",
                                    arg_pp,
                                    reader.getFormattedErrorMessages()));
      return false;
    }
  }

  Json::Value const& version = ppi["version"];
  if (version.asUInt() > 1) {
    cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to parse ",
                                  arg_pp, ": version ", version.asString()));
    return false;
  }

  Json::Value const& rules = ppi["rules"];
  if (rules.isArray()) {
    if (rules.size() != 1) {
      cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to parse ",
                                    arg_pp, ": expected 1 source entry"));
      return false;
    }

    for (auto const& rule : rules) {
      cm::optional<std::string> work_directory;
      Json::Value const& workdir = rule["work-directory"];
      if (workdir.isString()) {
        std::string wd;
        PARSE_BLOB(workdir, wd);
        work_directory = std::move(wd);
      } else if (!workdir.isNull()) {
        cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to parse ",
                                      arg_pp,
                                      ": work-directory is not a string"));
        return false;
      }

      if (rule.isMember("primary-output")) {
        Json::Value const& primary_output = rule["primary-output"];
        PARSE_FILENAME(primary_output, info->PrimaryOutput);
      }

      if (rule.isMember("outputs")) {
        Json::Value const& outputs = rule["outputs"];
        if (outputs.isArray()) {
          for (auto const& output : outputs) {
            std::string extra_output;
            PARSE_FILENAME(output, extra_output);

            info->ExtraOutputs.emplace_back(extra_output);
          }
        }
      }

      if (rule.isMember("provides")) {
        Json::Value const& provides = rule["provides"];
        if (!provides.isArray()) {
          cmSystemTools::Error(
            cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                     ": provides is not an array"));
          return false;
        }

        for (auto const& provide : provides) {
          cmSourceReqInfo provide_info;

          Json::Value const& logical_name = provide["logical-name"];
          PARSE_BLOB(logical_name, provide_info.LogicalName);

          if (provide.isMember("compiled-module-path")) {
            Json::Value const& compiled_module_path =
              provide["compiled-module-path"];
            PARSE_FILENAME(compiled_module_path,
                           provide_info.CompiledModulePath);
          }

          if (provide.isMember("unique-on-source-path")) {
            Json::Value const& unique_on_source_path =
              provide["unique-on-source-path"];
            if (!unique_on_source_path.isBool()) {
              cmSystemTools::Error(
                cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                         ": unique-on-source-path is not a boolean"));
              return false;
            }
            provide_info.UseSourcePath = unique_on_source_path.asBool();
          } else {
            provide_info.UseSourcePath = false;
          }

          if (provide.isMember("source-path")) {
            Json::Value const& source_path = provide["source-path"];
            PARSE_FILENAME(source_path, provide_info.SourcePath);
          } else if (provide_info.UseSourcePath) {
            cmSystemTools::Error(
              cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                       ": source-path is missing"));
            return false;
          }

          if (provide.isMember("is-interface")) {
            Json::Value const& is_interface = provide["is-interface"];
            if (!is_interface.isBool()) {
              cmSystemTools::Error(
                cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                         ": is-interface is not a boolean"));
              return false;
            }
            provide_info.IsInterface = is_interface.asBool();
          } else {
            provide_info.IsInterface = true;
          }

          info->Provides.push_back(provide_info);
        }
      }

      if (rule.isMember("requires")) {
        Json::Value const& reqs = rule["requires"];
        if (!reqs.isArray()) {
          cmSystemTools::Error(
            cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                     ": requires is not an array"));
          return false;
        }

        for (auto const& require : reqs) {
          cmSourceReqInfo require_info;

          Json::Value const& logical_name = require["logical-name"];
          PARSE_BLOB(logical_name, require_info.LogicalName);

          if (require.isMember("compiled-module-path")) {
            Json::Value const& compiled_module_path =
              require["compiled-module-path"];
            PARSE_FILENAME(compiled_module_path,
                           require_info.CompiledModulePath);
          }

          if (require.isMember("unique-on-source-path")) {
            Json::Value const& unique_on_source_path =
              require["unique-on-source-path"];
            if (!unique_on_source_path.isBool()) {
              cmSystemTools::Error(
                cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                         ": unique-on-source-path is not a boolean"));
              return false;
            }
            require_info.UseSourcePath = unique_on_source_path.asBool();
          } else {
            require_info.UseSourcePath = false;
          }

          if (require.isMember("source-path")) {
            Json::Value const& source_path = require["source-path"];
            PARSE_FILENAME(source_path, require_info.SourcePath);
          } else if (require_info.UseSourcePath) {
            cmSystemTools::Error(
              cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                       ": source-path is missing"));
            return false;
          }

          if (require.isMember("lookup-method")) {
            Json::Value const& lookup_method = require["lookup-method"];
            if (!lookup_method.isString()) {
              cmSystemTools::Error(
                cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                         ": lookup-method is not a string"));
              return false;
            }

            std::string lookup_method_str = lookup_method.asString();
            if (lookup_method_str == "by-name"_s) {
              require_info.Method = LookupMethod::ByName;
            } else if (lookup_method_str == "include-angle"_s) {
              require_info.Method = LookupMethod::IncludeAngle;
            } else if (lookup_method_str == "include-quote"_s) {
              require_info.Method = LookupMethod::IncludeQuote;
            } else {
              cmSystemTools::Error(cmStrCat(
                "-E cmake_ninja_dyndep failed to parse ", arg_pp,
                ": lookup-method is not a valid: ", lookup_method_str));
              return false;
            }
          } else if (require_info.UseSourcePath) {
            require_info.Method = LookupMethod::ByName;
          }

          info->Requires.push_back(require_info);
        }
      }
    }
  }

  return true;
}